

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMiscMatrixAlgo.cpp
# Opt level: O3

void anon_unknown.dwarf_8c458::getRandTRS(Rand48 *random,V3f *trans,V3f *rot,V3f *scale)

{
  double dVar1;
  int j;
  long lVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  undefined8 local_58;
  float local_50;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  dVar1 = Imath_2_5::erand48(random->_state);
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = dVar1;
  local_38._12_4_ = extraout_XMM0_Dd;
  dVar1 = Imath_2_5::erand48(random->_state);
  local_48._8_4_ = extraout_XMM0_Dc_00;
  local_48._0_8_ = dVar1;
  local_48._12_4_ = extraout_XMM0_Dd_00;
  dVar1 = Imath_2_5::erand48(random->_state);
  trans->x = (float)((1.0 - (double)local_38._0_8_) * -10.0 + (double)local_38._0_8_ * 10.0);
  trans->y = (float)((1.0 - (double)local_48._0_8_) * -10.0 + (double)local_48._0_8_ * 10.0);
  trans->z = (float)((1.0 - dVar1) * -10.0 + dVar1 * 10.0);
  dVar1 = Imath_2_5::erand48(random->_state);
  local_38._8_4_ = extraout_XMM0_Dc_01;
  local_38._0_8_ = dVar1;
  local_38._12_4_ = extraout_XMM0_Dd_01;
  dVar1 = Imath_2_5::erand48(random->_state);
  local_48._8_4_ = extraout_XMM0_Dc_02;
  local_48._0_8_ = dVar1;
  local_48._12_4_ = extraout_XMM0_Dd_02;
  dVar1 = Imath_2_5::erand48(random->_state);
  rot->x = (float)((1.0 - (double)local_38._0_8_) * -180.0 + (double)local_38._0_8_ * 180.0) *
           0.017453292;
  rot->y = (float)((1.0 - (double)local_48._0_8_) * -180.0 + (double)local_48._0_8_ * 180.0) *
           0.017453292;
  rot->z = (float)((1.0 - dVar1) * -180.0 + dVar1 * 180.0) * 0.017453292;
  dVar1 = Imath_2_5::erand48(random->_state);
  local_38._8_4_ = extraout_XMM0_Dc_03;
  local_38._0_8_ = dVar1;
  local_38._12_4_ = extraout_XMM0_Dd_03;
  dVar1 = Imath_2_5::erand48(random->_state);
  local_48._8_4_ = extraout_XMM0_Dc_04;
  local_48._0_8_ = dVar1;
  local_48._12_4_ = extraout_XMM0_Dd_04;
  dVar1 = Imath_2_5::erand48(random->_state);
  local_50 = (float)((1.0 - dVar1) * 1e-06 + dVar1 + dVar1);
  local_58 = CONCAT44((float)((1.0 - (double)local_48._0_8_) * 1e-06 +
                             (double)local_48._0_8_ + (double)local_48._0_8_),
                      (float)((1.0 - (double)local_38._0_8_) * 1e-06 +
                             (double)local_38._0_8_ + (double)local_38._0_8_));
  lVar2 = 0;
  do {
    dVar1 = Imath_2_5::erand48(random->_state);
    if (0.5 <= (1.0 - dVar1) * 0.0 + dVar1) {
      *(uint *)((long)&local_58 + lVar2 * 4) = *(uint *)((long)&local_58 + lVar2 * 4) ^ 0x80000000;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  scale->x = (float)(undefined4)local_58;
  scale->y = (float)local_58._4_4_;
  scale->z = local_50;
  return;
}

Assistant:

void
getRandTRS(Rand48& random, V3f& trans, V3f& rot, V3f& scale)
{
    // Translate 
    trans = V3f (random.nextf (-10, 10), 
                 random.nextf (-10, 10), 
                 random.nextf (-10, 10));
    // Rotate 
    rot = V3f (rad (random.nextf (-180, 180)),
               rad (random.nextf (-180, 180)),
               rad (random.nextf (-180, 180)));

    // Scale 
    V3f s(random.nextf (0.000001, 2.0),
          random.nextf (0.000001, 2.0),
          random.nextf (0.000001, 2.0));
    for (int j=0; j < 3; j++)
        if (random.nextf (0.0, 1.0) >= 0.5)
            s[j] *= -1;
    scale = s;
}